

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

bool __thiscall
HighsSymmetryDetection::splitCell(HighsSymmetryDetection *this,HighsInt cell,HighsInt splitPoint)

{
  int iVar1;
  bool bVar2;
  u32 a;
  u32 b;
  value_type vVar3;
  u64 uVar4;
  reference pvVar5;
  u64 uVar6;
  u64 uVar7;
  size_type sVar8;
  size_type sVar9;
  reference pvVar10;
  u32 *puVar11;
  u32 in_EDX;
  u32 in_ESI;
  long in_RDI;
  u32 diffVal;
  u32 certificateVal;
  u32 hCell;
  u32 hSplit;
  HighsInt in_stack_ffffffffffffff74;
  value_type vVar12;
  undefined4 in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff7c;
  value_type in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)(int)in_EDX);
  a = getVertexHash((HighsSymmetryDetection *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    in_stack_ffffffffffffff74);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)(int)in_ESI);
  b = getVertexHash((HighsSymmetryDetection *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    in_stack_ffffffffffffff74);
  uVar4 = HighsHashHelpers::pair_hash<0>(a,b);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)(int)in_ESI);
  uVar6 = HighsHashHelpers::pair_hash<1>(in_ESI,*pvVar5 - in_EDX);
  uVar7 = HighsHashHelpers::pair_hash<2>(in_EDX,in_EDX - in_ESI);
  vVar3 = (value_type)(uVar4 + uVar6 + uVar7 >> 0x20);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (!bVar2) {
    iVar1 = *(int *)(in_RDI + 0x290);
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1b8),
                         sVar9);
    *(uint *)(in_RDI + 0x290) =
         (uint)(iVar1 == (int)sVar8) * (uint)(vVar3 == *pvVar10) + *(int *)(in_RDI + 0x290);
    iVar1 = *(int *)(in_RDI + 0x294);
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1d0),
                         sVar9);
    *(uint *)(in_RDI + 0x294) =
         (uint)(iVar1 == (int)sVar8) * (uint)(vVar3 == *pvVar10) + *(int *)(in_RDI + 0x294);
    iVar1 = *(int *)(in_RDI + 0x290);
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
    if ((iVar1 <= (int)sVar8) &&
       (iVar1 = *(int *)(in_RDI + 0x294),
       sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0)),
       iVar1 <= (int)sVar8)) {
      in_stack_ffffffffffffff84 = *(int *)(in_RDI + 0x294);
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0));
      in_stack_ffffffffffffff7c = vVar3;
      if (in_stack_ffffffffffffff84 != (int)sVar8) {
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1a0)
                             ,(long)*(int *)(in_RDI + 0x294));
        in_stack_ffffffffffffff7c = *pvVar10;
      }
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff7c;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1d0),
                           (long)*(int *)(in_RDI + 0x294));
      if (*pvVar10 < in_stack_ffffffffffffff7c) {
        return false;
      }
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)(int)in_ESI);
  vVar12 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)(int)in_EDX);
  *pvVar5 = vVar12;
  puVar11 = (u32 *)std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)(int)in_ESI
                             );
  *puVar11 = in_EDX;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff7c,in_EDX));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (value_type_conflict3 *)CONCAT44(in_stack_ffffffffffffff7c,in_EDX));
  return true;
}

Assistant:

bool HighsSymmetryDetection::splitCell(HighsInt cell, HighsInt splitPoint) {
  u32 hSplit = getVertexHash(currentPartition[splitPoint]);
  u32 hCell = getVertexHash(currentPartition[cell]);

  u32 certificateVal =
      (HighsHashHelpers::pair_hash<0>(hSplit, hCell) +
       HighsHashHelpers::pair_hash<1>(
           cell, currentPartitionLinks[cell] - splitPoint) +
       HighsHashHelpers::pair_hash<2>(splitPoint, splitPoint - cell)) >>
      32;

  // employ prefix pruning scheme as in bliss
  if (!firstLeaveCertificate.empty()) {
    firstLeavePrefixLen +=
        (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size()) *
        (certificateVal == firstLeaveCertificate[currNodeCertificate.size()]);
    bestLeavePrefixLen +=
        (bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()) *
        (certificateVal == bestLeaveCertificate[currNodeCertificate.size()]);

    // if the node certificate is not a prefix of the first leave's certificate
    // and it comes lexicographically after the certificate value of the
    // lexicographically smallest leave certificate we prune the node
    if (firstLeavePrefixLen <= (HighsInt)currNodeCertificate.size() &&
        bestLeavePrefixLen <= (HighsInt)currNodeCertificate.size()) {
      u32 diffVal = bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()
                        ? certificateVal
                        : currNodeCertificate[bestLeavePrefixLen];
      if (diffVal > bestLeaveCertificate[bestLeavePrefixLen]) return false;
    }
  }

  currentPartitionLinks[splitPoint] = currentPartitionLinks[cell];
  currentPartitionLinks[cell] = splitPoint;
  cellCreationStack.push_back(splitPoint);
  currNodeCertificate.push_back(certificateVal);

  return true;
}